

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<float,3,3,0,3,3>,Eigen::Product<Eigen::Matrix<float,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<float,3,3,0,3,3>const>,1>,float,float>
               (Matrix<float,_3,_3,_0,_3,_3> *dst,
               Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>
               *src,assign_op<float,_float> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<float,_float> *param_2_local;
  Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>
  *src_local;
  Matrix<float,_3,_3,_0,_3,_3> *dst_local;
  
  IVar1 = Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>
          ::rows(src);
  cols = Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>
         ::cols(src);
  IVar2 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>);
  if (IVar2 == IVar1) {
    IVar2 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>);
    if (IVar2 == cols) goto LAB_00228d8d;
  }
  PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,IVar1,cols);
LAB_00228d8d:
  IVar2 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, 3, 3>, SrcXprType = Eigen::Product<Eigen::Matrix<float, 3, 3>, Eigen::Transpose<const Eigen::Matrix<float, 3, 3>>, 1>, T1 = float, T2 = float]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}